

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

Cec3_Man_t * Cec3_ManCreate(Gia_Man_t *pAig,Cec3_Par_t *pPars)

{
  uint nCapMin;
  int iVar1;
  Cec3_Man_t *pCVar2;
  abctime aVar3;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  ulong uVar5;
  bmcg_sat_solver *pbVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int iVar10;
  
  pCVar2 = (Cec3_Man_t *)calloc(1,0xa0);
  aVar3 = Abc_Clock();
  pCVar2->timeStart = aVar3;
  pCVar2->pPars = pPars;
  pCVar2->pAig = pAig;
  p = Gia_ManStart(pAig->nObjs);
  pCVar2->pNew = p;
  Gia_ManFillValue(pAig);
  pAig->pObjs->Value = 0;
  for (iVar10 = 0; iVar10 < pAig->vCis->nSize; iVar10 = iVar10 + 1) {
    pGVar4 = Gia_ManCi(pAig,iVar10);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pObj = Gia_ManAppendObj(p);
    uVar5 = *(ulong *)pObj;
    *(ulong *)pObj = uVar5 | 0x9fffffff;
    *(ulong *)pObj =
         uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar8 = p->vCis;
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(pVVar8,iVar1);
    iVar1 = Gia_ObjId(p,pObj);
    pGVar4->Value = iVar1 * 2;
  }
  Gia_ManHashAlloc(p);
  nCapMin = p->nObjs;
  Vec_IntGrow(&p->vCopies2,nCapMin);
  uVar5 = 0;
  uVar9 = 0;
  if (0 < (int)nCapMin) {
    uVar9 = (ulong)nCapMin;
  }
  for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
    (p->vCopies2).pArray[uVar5] = -1;
  }
  (p->vCopies2).nSize = nCapMin;
  pbVar6 = bmcg_sat_solver_start();
  pCVar2->pSat = pbVar6;
  pVVar7 = Vec_PtrAlloc(1000);
  pCVar2->vFrontier = pVVar7;
  iVar10 = 100;
  pVVar7 = Vec_PtrAlloc(100);
  pCVar2->vFanins = pVVar7;
  pVVar8 = Vec_IntAlloc(iVar10);
  pCVar2->vNodesNew = pVVar8;
  pVVar8 = Vec_IntAlloc(iVar10);
  pCVar2->vSatVars = pVVar8;
  pVVar8 = Vec_IntAlloc(iVar10);
  pCVar2->vObjSatPairs = pVVar8;
  pVVar8 = Vec_IntAlloc(iVar10);
  pCVar2->vCexTriples = pVVar8;
  pAig->pData = pbVar6;
  return pCVar2;
}

Assistant:

Cec3_Man_t * Cec3_ManCreate( Gia_Man_t * pAig, Cec3_Par_t * pPars )
{
    Cec3_Man_t * p;
    Gia_Obj_t * pObj; int i;
    //satoko_opts_t Pars;
    //assert( Gia_ManRegNum(pAig) == 0 );
    p = ABC_CALLOC( Cec3_Man_t, 1 );
    memset( p, 0, sizeof(Cec3_Man_t) );
    p->timeStart    = Abc_Clock();
    p->pPars        = pPars;
    p->pAig         = pAig;
    // create new manager
    p->pNew         = Gia_ManStart( Gia_ManObjNum(pAig) );
    Gia_ManFillValue( pAig );
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_ManAppendCi( p->pNew );
    Gia_ManHashAlloc( p->pNew );
    Vec_IntFill( &p->pNew->vCopies2, Gia_ManObjNum(p->pNew), -1 );
    // SAT solving
    //memset( &Pars, 0, sizeof(satoko_opts_t) );
    p->pSat         = bmcg_sat_solver_start();
    p->vFrontier    = Vec_PtrAlloc( 1000 );
    p->vFanins      = Vec_PtrAlloc( 100 );
    p->vNodesNew    = Vec_IntAlloc( 100 );
    p->vSatVars     = Vec_IntAlloc( 100 );
    p->vObjSatPairs = Vec_IntAlloc( 100 );
    p->vCexTriples  = Vec_IntAlloc( 100 );
    //Pars.conf_limit = pPars->nConfLimit;
    //satoko_configure(p->pSat, &Pars);
    // remember pointer to the solver in the AIG manager
    pAig->pData     = p->pSat;
    return p;
}